

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::commitExposure(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  MMAL_PARAMETER_EXPOSUREMODE_T exp_mode;
  MMAL_PARAMETER_HEADER_T local_1c;
  MMAL_PARAM_EXPOSUREMODE_T local_14;
  
  local_1c.id = 0x10012;
  local_1c.size = 0xc;
  local_14 = convertExposure(this,this->exposure);
  MVar1 = mmal_port_parameter_set(this->camera->control,&local_1c);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    std::operator<<(poVar2,": Failed to set exposure parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitExposure() {
            MMAL_PARAMETER_EXPOSUREMODE_T exp_mode = {{MMAL_PARAMETER_EXPOSURE_MODE,sizeof ( exp_mode ) }, convertExposure ( exposure ) };
            if ( mmal_port_parameter_set ( camera->control, &exp_mode.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set exposure parameter.\n";
        }